

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

void __thiscall spvtools::Optimizer::SetMessageConsumer(Optimizer *this,MessageConsumer *c)

{
  uint uVar1;
  uint32_t uVar2;
  pointer pIVar3;
  Pass *this_00;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> local_60;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> local_40;
  uint local_1c;
  MessageConsumer *pMStack_18;
  uint32_t i;
  MessageConsumer *c_local;
  Optimizer *this_local;
  
  local_1c = 0;
  pMStack_18 = c;
  c_local = (MessageConsumer *)this;
  while( true ) {
    uVar1 = local_1c;
    pIVar3 = std::
             unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
             ::operator->(&this->impl_);
    uVar2 = opt::PassManager::NumPasses(&pIVar3->pass_manager);
    if (uVar2 <= uVar1) break;
    pIVar3 = std::
             unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
             ::operator->(&this->impl_);
    this_00 = opt::PassManager::GetPass(&pIVar3->pass_manager,local_1c);
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    function(&local_40,c);
    opt::Pass::SetMessageConsumer(this_00,&local_40);
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    ~function(&local_40);
    local_1c = local_1c + 1;
  }
  pIVar3 = std::
           unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>::
           operator->(&this->impl_);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&local_60,c);
  opt::PassManager::SetMessageConsumer(&pIVar3->pass_manager,&local_60);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_60);
  return;
}

Assistant:

void Optimizer::SetMessageConsumer(MessageConsumer c) {
  // All passes' message consumer needs to be updated.
  for (uint32_t i = 0; i < impl_->pass_manager.NumPasses(); ++i) {
    impl_->pass_manager.GetPass(i)->SetMessageConsumer(c);
  }
  impl_->pass_manager.SetMessageConsumer(std::move(c));
}